

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O1

string * __thiscall
leveldb::ParsedInternalKey::DebugString_abi_cxx11_
          (string *__return_storage_ptr__,ParsedInternalKey *this)

{
  char *pcVar1;
  ostream *poVar2;
  Slice *value;
  long in_FS_OFFSET;
  ostringstream ss;
  long *local_1f0;
  undefined8 uStack_1e8;
  long *local_1e0;
  undefined8 uStack_1d8;
  long local_1d0 [2];
  string local_1c0;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  local_1c0._M_dataplus._M_p._0_1_ = 0x27;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(char *)&local_1c0,1);
  pcVar1 = (this->user_key).data_;
  local_1e0 = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e0,pcVar1,pcVar1 + (this->user_key).size_);
  local_1f0 = local_1e0;
  uStack_1e8 = uStack_1d8;
  EscapeString_abi_cxx11_(&local_1c0,(leveldb *)&local_1f0,value);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)CONCAT71(local_1c0._M_dataplus._M_p._1_7_,
                                              local_1c0._M_dataplus._M_p._0_1_),
                      local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' @ ",4);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," : ",3);
  std::ostream::operator<<((ostream *)poVar2,this->type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1c0._M_dataplus._M_p._1_7_,local_1c0._M_dataplus._M_p._0_1_) !=
      &local_1c0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_1c0._M_dataplus._M_p._1_7_,local_1c0._M_dataplus._M_p._0_1_),
                    local_1c0.field_2._M_allocated_capacity + 1);
  }
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0,local_1d0[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string ParsedInternalKey::DebugString() const {
  std::ostringstream ss;
  ss << '\'' << EscapeString(user_key.ToString()) << "' @ " << sequence << " : "
     << static_cast<int>(type);
  return ss.str();
}